

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersector1<4,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::InstanceIntersector1>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 (*pauVar13) [16];
  byte bVar14;
  bool bVar15;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  byte bVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  InstancePrimitive *prim;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_fd8 [8];
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 == 8) {
    bVar15 = false;
  }
  else {
    uStack_f70 = 0;
    fVar1 = (context->query_radius).field_0.m128[0];
    auVar36 = ZEXT1664(CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(fVar1,fVar1))));
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      local_fc8 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      aVar5 = (context->query_radius).field_0;
      local_fc8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
    }
    pauVar23 = (undefined1 (*) [16])local_f68;
    uVar2 = *(undefined4 *)&(query->p).field_0;
    local_fb8._4_4_ = uVar2;
    local_fb8._0_4_ = uVar2;
    local_fb8._8_4_ = uVar2;
    local_fb8._12_4_ = uVar2;
    auVar35 = ZEXT1664(local_fb8);
    fVar3 = (query->p).field_0.field_0.y;
    auVar34._4_4_ = fVar3;
    auVar34._0_4_ = fVar3;
    auVar34._8_4_ = fVar3;
    auVar34._12_4_ = fVar3;
    fVar4 = (query->p).field_0.field_0.z;
    auVar33._4_4_ = fVar4;
    auVar33._0_4_ = fVar4;
    auVar33._8_4_ = fVar4;
    auVar33._12_4_ = fVar4;
    local_f98 = (context->query_radius).field_0.m128[1];
    fStack_f94 = local_f98;
    fStack_f90 = local_f98;
    fStack_f8c = local_f98;
    local_fa8 = (context->query_radius).field_0.m128[2];
    fStack_fa4 = local_fa8;
    fStack_fa0 = local_fa8;
    fStack_f9c = local_fa8;
    fVar1 = fVar1 * fVar1;
    auVar25._4_4_ = fVar1;
    auVar25._0_4_ = fVar1;
    auVar25._8_4_ = fVar1;
    auVar25._12_4_ = fVar1;
    bVar15 = false;
    do {
      local_f88 = auVar36._0_16_;
      auVar10 = vsubps_avx(auVar35._0_16_,local_f88);
      auVar26._0_4_ = auVar35._0_4_ + auVar36._0_4_;
      auVar26._4_4_ = auVar35._4_4_ + auVar36._4_4_;
      auVar26._8_4_ = auVar35._8_4_ + auVar36._8_4_;
      auVar26._12_4_ = auVar35._12_4_ + auVar36._12_4_;
      auVar11._4_4_ = fStack_f94;
      auVar11._0_4_ = local_f98;
      auVar11._8_4_ = fStack_f90;
      auVar11._12_4_ = fStack_f8c;
      auVar11 = vsubps_avx(auVar34,auVar11);
      auVar27._0_4_ = fVar3 + local_f98;
      auVar27._4_4_ = fVar3 + fStack_f94;
      auVar27._8_4_ = fVar3 + fStack_f90;
      auVar27._12_4_ = fVar3 + fStack_f8c;
      auVar12._4_4_ = fStack_fa4;
      auVar12._0_4_ = local_fa8;
      auVar12._8_4_ = fStack_fa0;
      auVar12._12_4_ = fStack_f9c;
      auVar12 = vsubps_avx(auVar33,auVar12);
      auVar28._0_4_ = fVar4 + local_fa8;
      auVar28._4_4_ = fVar4 + fStack_fa4;
      auVar28._8_4_ = fVar4 + fStack_fa0;
      auVar28._12_4_ = fVar4 + fStack_f9c;
      while( true ) {
        pauVar13 = pauVar23 + -1;
        pauVar23 = pauVar23 + -1;
        if ((float)local_fc8._0_4_ < *(float *)(*pauVar13 + 8)) break;
        uVar18 = *(ulong *)*pauVar23;
LAB_01933414:
        auVar29 = auVar35._0_16_;
        if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
          if ((uVar18 & 8) != 0) {
LAB_01933755:
            lVar21 = (ulong)((uint)uVar18 & 0xf) - 8;
            if (lVar21 != 0) {
              prim = (InstancePrimitive *)(uVar18 & 0xfffffffffffffff0);
              bVar14 = 0;
              do {
                bVar22 = bVar14;
                bVar16 = InstanceIntersector1::pointQuery(query,context,prim);
                prim = prim + 1;
                lVar21 = lVar21 + -1;
                bVar14 = bVar22 | bVar16;
              } while (lVar21 != 0);
              if (bVar22 == 0 && !bVar16) {
                auVar36 = ZEXT1664(local_f88);
                auVar35 = ZEXT1664(local_fb8);
              }
              else {
                uVar2 = *(undefined4 *)&(context->query_radius).field_0;
                auVar36 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
                local_f98 = (context->query_radius).field_0.m128[1];
                fStack_f94 = local_f98;
                fStack_f90 = local_f98;
                fStack_f8c = local_f98;
                local_fa8 = (context->query_radius).field_0.m128[2];
                fStack_fa4 = local_fa8;
                fStack_fa0 = local_fa8;
                fStack_f9c = local_fa8;
                auVar35 = ZEXT1664(local_fb8);
                if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
                  local_fc8 = ZEXT416((uint)(query->radius * query->radius));
                }
                else {
                  aVar5 = (context->query_radius).field_0;
                  local_fc8 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
                }
                bVar15 = true;
              }
            }
            break;
          }
          auVar30 = vmaxps_avx(auVar29,*(undefined1 (*) [16])(uVar18 + 0x20));
          auVar31 = vminps_avx(auVar30,*(undefined1 (*) [16])(uVar18 + 0x30));
          auVar30 = vmaxps_avx(auVar34,*(undefined1 (*) [16])(uVar18 + 0x40));
          auVar30 = vminps_avx(auVar30,*(undefined1 (*) [16])(uVar18 + 0x50));
          auVar31 = vsubps_avx(auVar31,auVar29);
          auVar30 = vsubps_avx(auVar30,auVar34);
          auVar29 = vmaxps_avx(auVar33,*(undefined1 (*) [16])(uVar18 + 0x60));
          auVar29 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar18 + 0x70));
          auVar29 = vsubps_avx(auVar29,auVar33);
          local_fd8._0_4_ =
               auVar31._0_4_ * auVar31._0_4_ + auVar30._0_4_ * auVar30._0_4_ +
               auVar29._0_4_ * auVar29._0_4_;
          local_fd8._4_4_ =
               auVar31._4_4_ * auVar31._4_4_ + auVar30._4_4_ * auVar30._4_4_ +
               auVar29._4_4_ * auVar29._4_4_;
          fStack_fd0 = auVar31._8_4_ * auVar31._8_4_ + auVar30._8_4_ * auVar30._8_4_ +
                       auVar29._8_4_ * auVar29._8_4_;
          fStack_fcc = auVar31._12_4_ * auVar31._12_4_ + auVar30._12_4_ * auVar30._12_4_ +
                       auVar29._12_4_ * auVar29._12_4_;
          auVar29 = vcmpps_avx(_local_fd8,auVar25,2);
          auVar30 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x20),
                               *(undefined1 (*) [16])(uVar18 + 0x30),2);
          auVar29 = vandps_avx(auVar29,auVar30);
        }
        else {
          if ((uVar18 & 8) != 0) goto LAB_01933755;
          auVar30 = *(undefined1 (*) [16])(uVar18 + 0x20);
          auVar31 = *(undefined1 (*) [16])(uVar18 + 0x30);
          auVar8 = vmaxps_avx(auVar29,auVar30);
          auVar8 = vminps_avx(auVar8,auVar31);
          auVar8 = vsubps_avx(auVar8,auVar29);
          auVar29 = vmaxps_avx(auVar34,*(undefined1 (*) [16])(uVar18 + 0x40));
          auVar29 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar18 + 0x50));
          auVar32 = vsubps_avx(auVar29,auVar34);
          auVar29 = vmaxps_avx(auVar33,*(undefined1 (*) [16])(uVar18 + 0x60));
          auVar29 = vminps_avx(auVar29,*(undefined1 (*) [16])(uVar18 + 0x70));
          auVar29 = vsubps_avx(auVar29,auVar33);
          auVar35 = ZEXT1664(local_fb8);
          local_fd8._4_4_ =
               auVar8._4_4_ * auVar8._4_4_ + auVar32._4_4_ * auVar32._4_4_ +
               auVar29._4_4_ * auVar29._4_4_;
          local_fd8._0_4_ =
               auVar8._0_4_ * auVar8._0_4_ + auVar32._0_4_ * auVar32._0_4_ +
               auVar29._0_4_ * auVar29._0_4_;
          fStack_fd0 = auVar8._8_4_ * auVar8._8_4_ + auVar32._8_4_ * auVar32._8_4_ +
                       auVar29._8_4_ * auVar29._8_4_;
          fStack_fcc = auVar8._12_4_ * auVar8._12_4_ + auVar32._12_4_ * auVar32._12_4_ +
                       auVar29._12_4_ * auVar29._12_4_;
          auVar29 = vcmpps_avx(auVar30,auVar31,2);
          auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x50),auVar11,5);
          auVar29 = vandps_avx(auVar29,auVar8);
          auVar30 = vcmpps_avx(auVar30,auVar26,2);
          auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x40),auVar27,2);
          auVar30 = vandps_avx(auVar8,auVar30);
          auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x70),auVar12,5);
          auVar29 = vandps_avx(auVar29,auVar8);
          auVar31 = vcmpps_avx(auVar31,auVar10,5);
          auVar8 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0x60),auVar28,2);
          auVar31 = vandps_avx(auVar31,auVar8);
          auVar30 = vandps_avx(auVar30,auVar31);
          auVar29 = vandps_avx(auVar29,auVar30);
        }
        auVar29 = vpslld_avx(auVar29,0x1f);
        uVar17 = vmovmskps_avx(auVar29);
        if (uVar17 != 0) {
          uVar17 = uVar17 & 0xff;
          uVar24 = uVar18 & 0xfffffffffffffff0;
          lVar21 = 0;
          for (uVar18 = (ulong)uVar17; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
          {
            lVar21 = lVar21 + 1;
          }
          uVar18 = *(ulong *)(uVar24 + lVar21 * 8);
          uVar17 = uVar17 - 1 & uVar17;
          uVar19 = (ulong)uVar17;
          if (uVar17 != 0) {
            uVar6 = *(uint *)(local_fd8 + lVar21 * 4);
            lVar21 = 0;
            for (; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            uVar17 = uVar17 - 1 & uVar17;
            uVar20 = (ulong)uVar17;
            uVar19 = *(ulong *)(uVar24 + lVar21 * 8);
            uVar7 = *(uint *)(local_fd8 + lVar21 * 4);
            if (uVar17 == 0) {
              if (uVar6 < uVar7) {
                *(ulong *)*pauVar23 = uVar19;
                *(uint *)(*pauVar23 + 8) = uVar7;
                pauVar23 = pauVar23 + 1;
              }
              else {
                *(ulong *)*pauVar23 = uVar18;
                *(uint *)(*pauVar23 + 8) = uVar6;
                pauVar23 = pauVar23 + 1;
                uVar18 = uVar19;
              }
            }
            else {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar18;
              auVar29 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar6));
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar19;
              auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar7));
              lVar21 = 0;
              for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                lVar21 = lVar21 + 1;
              }
              uVar17 = uVar17 - 1 & uVar17;
              uVar18 = (ulong)uVar17;
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(uVar24 + lVar21 * 8);
              auVar8 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_fd8 + lVar21 * 4)));
              auVar31 = vpcmpgtd_avx(auVar30,auVar29);
              if (uVar17 == 0) {
                auVar32 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar30,auVar29,auVar32);
                auVar29 = vblendvps_avx(auVar29,auVar30,auVar32);
                auVar30 = vpcmpgtd_avx(auVar8,auVar31);
                auVar32 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar8,auVar31,auVar32);
                auVar31 = vblendvps_avx(auVar31,auVar8,auVar32);
                auVar8 = vpcmpgtd_avx(auVar31,auVar29);
                auVar32 = vpshufd_avx(auVar8,0xaa);
                auVar8 = vblendvps_avx(auVar31,auVar29,auVar32);
                auVar29 = vblendvps_avx(auVar29,auVar31,auVar32);
                *pauVar23 = auVar29;
                pauVar23[1] = auVar8;
                uVar18 = auVar30._0_8_;
                pauVar23 = pauVar23 + 2;
              }
              else {
                lVar21 = 0;
                for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
                  lVar21 = lVar21 + 1;
                }
                auVar32._8_8_ = 0;
                auVar32._0_8_ = *(ulong *)(uVar24 + lVar21 * 8);
                auVar9 = vpunpcklqdq_avx(auVar32,ZEXT416(*(uint *)(local_fd8 + lVar21 * 4)));
                auVar32 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar30,auVar29,auVar32);
                auVar29 = vblendvps_avx(auVar29,auVar30,auVar32);
                auVar30 = vpcmpgtd_avx(auVar9,auVar8);
                auVar32 = vpshufd_avx(auVar30,0xaa);
                auVar30 = vblendvps_avx(auVar9,auVar8,auVar32);
                auVar8 = vblendvps_avx(auVar8,auVar9,auVar32);
                auVar32 = vpcmpgtd_avx(auVar8,auVar29);
                auVar9 = vpshufd_avx(auVar32,0xaa);
                auVar32 = vblendvps_avx(auVar8,auVar29,auVar9);
                auVar29 = vblendvps_avx(auVar29,auVar8,auVar9);
                auVar8 = vpcmpgtd_avx(auVar30,auVar31);
                auVar9 = vpshufd_avx(auVar8,0xaa);
                auVar8 = vblendvps_avx(auVar30,auVar31,auVar9);
                auVar30 = vblendvps_avx(auVar31,auVar30,auVar9);
                auVar31 = vpcmpgtd_avx(auVar32,auVar30);
                auVar9 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar32,auVar30,auVar9);
                auVar30 = vblendvps_avx(auVar30,auVar32,auVar9);
                *pauVar23 = auVar29;
                pauVar23[1] = auVar30;
                pauVar23[2] = auVar31;
                uVar18 = auVar8._0_8_;
                pauVar23 = pauVar23 + 3;
              }
            }
          }
          goto LAB_01933414;
        }
        if (pauVar23 == (undefined1 (*) [16])&local_f78) {
          return bVar15;
        }
      }
      auVar25._0_4_ = auVar36._0_4_ * auVar36._0_4_;
      auVar25._4_4_ = auVar36._4_4_ * auVar36._4_4_;
      auVar25._8_4_ = auVar36._8_4_ * auVar36._8_4_;
      auVar25._12_4_ = auVar36._12_4_ * auVar36._12_4_;
    } while (pauVar23 != (undefined1 (*) [16])&local_f78);
  }
  return bVar15;
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }